

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O1

void xmlFreePatternList(xmlPatternPtr comp)

{
  _xmlPattern *p_Var1;
  xmlStepOpPtr pxVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  
  if (comp != (xmlPatternPtr)0x0) {
    do {
      p_Var1 = comp->next;
      comp->next = (_xmlPattern *)0x0;
      if (comp->stream != (xmlStreamCompPtr)0x0) {
        xmlFreeStreamComp(comp->stream);
      }
      if (comp->pattern != (xmlChar *)0x0) {
        (*xmlFree)(comp->pattern);
      }
      if (comp->steps != (xmlStepOpPtr)0x0) {
        if ((comp->dict == (xmlDictPtr)0x0) && (0 < comp->nbStep)) {
          lVar4 = 0x10;
          lVar5 = 0;
          do {
            pxVar2 = comp->steps;
            pvVar3 = *(void **)((long)pxVar2 + lVar4 + -8);
            if (pvVar3 != (void *)0x0) {
              (*xmlFree)(pvVar3);
            }
            pvVar3 = *(void **)((long)&pxVar2->op + lVar4);
            if (pvVar3 != (void *)0x0) {
              (*xmlFree)(pvVar3);
            }
            lVar5 = lVar5 + 1;
            lVar4 = lVar4 + 0x18;
          } while (lVar5 < comp->nbStep);
        }
        (*xmlFree)(comp->steps);
      }
      if (comp->dict != (xmlDictPtr)0x0) {
        xmlDictFree(comp->dict);
      }
      *(undefined4 *)&comp->steps = 0xffffffff;
      *(undefined4 *)((long)&comp->steps + 4) = 0xffffffff;
      *(undefined4 *)&comp->stream = 0xffffffff;
      *(undefined4 *)((long)&comp->stream + 4) = 0xffffffff;
      comp->flags = -1;
      comp->nbStep = -1;
      comp->maxStep = -1;
      *(undefined4 *)&comp->field_0x2c = 0xffffffff;
      *(undefined4 *)&comp->next = 0xffffffff;
      *(undefined4 *)((long)&comp->next + 4) = 0xffffffff;
      *(undefined4 *)&comp->pattern = 0xffffffff;
      *(undefined4 *)((long)&comp->pattern + 4) = 0xffffffff;
      *(undefined4 *)&comp->data = 0xffffffff;
      *(undefined4 *)((long)&comp->data + 4) = 0xffffffff;
      *(undefined4 *)&comp->dict = 0xffffffff;
      *(undefined4 *)((long)&comp->dict + 4) = 0xffffffff;
      (*xmlFree)(comp);
      comp = p_Var1;
    } while (p_Var1 != (_xmlPattern *)0x0);
  }
  return;
}

Assistant:

void
xmlFreePatternList(xmlPatternPtr comp) {
    xmlPatternPtr cur;

    while (comp != NULL) {
	cur = comp;
	comp = comp->next;
	cur->next = NULL;
	xmlFreePatternInternal(cur);
    }
}